

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts3SegReaderCursor(Fts3Table *p,int iLangid,int iIndex,int iLevel,char *zTerm,int nTerm,
                       int isPrefix,int isScan,Fts3MultiSegReader *pCsr)

{
  Fts3Hash *pH;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Fts3SegReader **ppFVar5;
  Fts3SegReader *pFVar6;
  Mem *pMVar7;
  i64 iVar8;
  char *zNode;
  ulong iValue;
  int iVar9;
  uint uVar10;
  size_t __nmemb;
  u64 uVar11;
  Fts3SegReader **pOld;
  long lVar12;
  long lVar13;
  bool bVar14;
  Fts3SegReader *pSeg;
  uint local_74;
  int local_70;
  uint local_6c;
  sqlite3_int64 *local_68;
  Fts3Table *local_60;
  char *local_58;
  sqlite3_int64 iStartBlock;
  sqlite3_int64 iLeavesEndBlock;
  uint local_3c;
  size_t local_38;
  
  local_68 = (sqlite3_int64 *)CONCAT44(local_68._4_4_,iLangid);
  local_6c = isScan;
  iVar2 = 0;
  local_74 = iIndex;
  local_70 = nTerm;
  local_58 = zTerm;
  if ((iLevel < 0) && (iVar2 = 0, p->aIndex != (Fts3Index *)0x0)) {
    local_3c = isScan | isPrefix;
    pH = &p->aIndex[iIndex].hPending;
    local_60 = p;
    if (local_3c == 0) {
      pSeg = (Fts3SegReader *)sqlite3Fts3HashFindElem(pH,zTerm,nTerm);
      pOld = &pSeg;
      uVar10 = (uint)(pSeg != (Fts3SegReader *)0x0);
      if (pSeg == (Fts3SegReader *)0x0) {
        pOld = (Fts3SegReader **)0x0;
      }
      iVar2 = 0;
    }
    else {
      pSeg = (Fts3SegReader *)pH->first;
      if (pSeg == (Fts3SegReader *)0x0) {
        iVar2 = 0;
        __nmemb = 0;
        pOld = (Fts3SegReader **)0x0;
      }
      else {
        local_38 = (size_t)nTerm;
        pOld = (Fts3SegReader **)0x0;
        __nmemb = 0;
        iVar2 = 0;
        iVar4 = 0;
        iVar3 = iVar2;
        do {
          iVar9 = (int)__nmemb;
          if ((local_70 == 0) ||
             ((bVar14 = false, local_70 <= (int)pSeg->iCurrentBlock &&
              (iVar1 = bcmp((void *)pSeg->iEndBlock,local_58,local_38), iVar1 == 0)))) {
            ppFVar5 = pOld;
            if (iVar9 == iVar4) {
              iVar4 = iVar4 + 0x10;
              iVar2 = sqlite3_initialize();
              if (iVar2 == 0) {
                uVar11 = (u64)(uint)(iVar4 * 8);
                if (iVar4 * 8 < 1) {
                  uVar11 = 0;
                }
                ppFVar5 = (Fts3SegReader **)sqlite3Realloc(pOld,uVar11);
              }
              else {
                ppFVar5 = (Fts3SegReader **)0x0;
              }
              bVar14 = ppFVar5 == (Fts3SegReader **)0x0;
              iVar2 = iVar3;
              if (bVar14) {
                __nmemb = 0;
                iVar2 = 7;
              }
              iVar9 = (int)__nmemb;
              iVar3 = iVar2;
              if (bVar14) goto LAB_001b480d;
            }
            __nmemb = (size_t)(iVar9 + 1);
            ppFVar5[iVar9] = pSeg;
            bVar14 = false;
            pOld = ppFVar5;
          }
LAB_001b480d:
        } while ((!bVar14) && (pSeg = *(Fts3SegReader **)pSeg, pSeg != (Fts3SegReader *)0x0));
      }
      uVar10 = (uint)__nmemb;
      if (1 < (int)uVar10) {
        qsort(pOld,__nmemb,8,fts3CompareElemByTerm);
      }
    }
    if ((int)uVar10 < 1) {
      pFVar6 = (Fts3SegReader *)0x0;
    }
    else {
      uVar11 = (ulong)uVar10 * 8 + 0x90;
      iVar3 = sqlite3_initialize();
      if (iVar3 == 0) {
        pFVar6 = (Fts3SegReader *)sqlite3Malloc(uVar11);
      }
      else {
        pFVar6 = (Fts3SegReader *)0x0;
      }
      if (pFVar6 == (Fts3SegReader *)0x0) {
        iVar2 = 7;
      }
      else {
        memset(pFVar6,0,uVar11);
        pFVar6->iIdx = 0x7fffffff;
        pFVar6->ppNextElem = (Fts3HashElem **)(pFVar6 + 1);
        memcpy(pFVar6 + 1,pOld,(ulong)uVar10 << 3);
      }
    }
    if (local_3c != 0) {
      sqlite3_free(pOld);
    }
    p = local_60;
    if ((iVar2 == 0) && (pFVar6 != (Fts3SegReader *)0x0)) {
      iVar2 = fts3SegReaderCursorAppend(pCsr,pFVar6);
    }
  }
  if (iLevel == -1) {
    pFVar6 = (Fts3SegReader *)0x0;
    goto LAB_001b4bd1;
  }
  local_60 = p;
  if (iVar2 == 0) {
    pSeg = (Fts3SegReader *)0x0;
    if (iLevel < 0) {
      iVar2 = fts3SqlStmt(p,0xd,(sqlite3_stmt **)&pSeg,(sqlite3_value **)0x0);
      pFVar6 = pSeg;
      if (iVar2 == 0) {
        lVar12 = (long)(int)local_68;
        lVar13 = (long)(int)local_74;
        sqlite3_bind_int64((sqlite3_stmt *)pSeg,1,(p->nIndex * lVar12 + lVar13) * 0x400);
        iValue = (p->nIndex * lVar12 + lVar13) * 0x400 | 0x3ff;
        iVar2 = 2;
        goto LAB_001b4a1c;
      }
    }
    else {
      iVar2 = fts3SqlStmt(p,0xc,(sqlite3_stmt **)&pSeg,(sqlite3_value **)0x0);
      pFVar6 = pSeg;
      if (iVar2 == 0) {
        iValue = (ulong)(uint)iLevel +
                 ((long)(int)local_74 + (long)p->nIndex * (long)(int)local_68) * 0x400;
        iVar2 = 1;
LAB_001b4a1c:
        sqlite3_bind_int64((sqlite3_stmt *)pFVar6,iVar2,iValue);
        pFVar6 = pSeg;
        iVar2 = 0;
      }
    }
  }
  else {
    pFVar6 = (Fts3SegReader *)0x0;
  }
  local_68 = &iLeavesEndBlock;
  if (isPrefix == 0) {
    local_68 = (sqlite3_int64 *)0x0;
  }
  local_6c = local_6c | isPrefix;
  local_74 = (uint)(local_6c == 0);
  do {
    if ((iVar2 != 0) || (iVar2 = sqlite3_step((sqlite3_stmt *)pFVar6), iVar2 != 100))
    goto LAB_001b4bd1;
    pSeg = (Fts3SegReader *)0x0;
    pMVar7 = columnMem((sqlite3_stmt *)pFVar6,1);
    iVar8 = sqlite3VdbeIntValue(pMVar7);
    columnMallocFailure((sqlite3_stmt *)pFVar6);
    iStartBlock = iVar8;
    pMVar7 = columnMem((sqlite3_stmt *)pFVar6,2);
    iVar8 = sqlite3VdbeIntValue(pMVar7);
    columnMallocFailure((sqlite3_stmt *)pFVar6);
    iLeavesEndBlock = iVar8;
    pMVar7 = columnMem((sqlite3_stmt *)pFVar6,3);
    iVar8 = sqlite3VdbeIntValue(pMVar7);
    columnMallocFailure((sqlite3_stmt *)pFVar6);
    iVar3 = sqlite3_column_bytes((sqlite3_stmt *)pFVar6,4);
    pMVar7 = columnMem((sqlite3_stmt *)pFVar6,4);
    zNode = (char *)sqlite3_value_blob(pMVar7);
    columnMallocFailure((sqlite3_stmt *)pFVar6);
    if ((local_58 == (char *)0x0) || ((iStartBlock == 0 || (zNode == (char *)0x0)))) {
LAB_001b4b6e:
      iVar2 = sqlite3Fts3SegReaderNew
                        (pCsr->nSegment + 1,local_74,iStartBlock,iLeavesEndBlock,iVar8,zNode,iVar3,
                         &pSeg);
      if (iVar2 == 0) {
        iVar2 = fts3SegReaderCursorAppend(pCsr,pSeg);
        iVar4 = 0;
      }
      else {
        iVar4 = 4;
      }
    }
    else {
      iVar2 = fts3SelectLeaf(local_60,local_58,local_70,zNode,iVar3,&iStartBlock,local_68);
      if (iVar2 == 0 && local_6c == 0) {
        iLeavesEndBlock = iStartBlock;
        iVar4 = 0;
      }
      else {
        iVar4 = (uint)(iVar2 != 0) << 2;
      }
      if (iVar2 == 0) goto LAB_001b4b6e;
    }
  } while (iVar4 == 0);
  if (iVar4 != 4) {
    return iVar4;
  }
LAB_001b4bd1:
  iVar3 = sqlite3_reset((sqlite3_stmt *)pFVar6);
  if (iVar2 != 0x65) {
    iVar3 = iVar2;
  }
  return iVar3;
}

Assistant:

static int fts3SegReaderCursor(
  Fts3Table *p,                   /* FTS3 table handle */
  int iLangid,                    /* Language id */
  int iIndex,                     /* Index to search (from 0 to p->nIndex-1) */
  int iLevel,                     /* Level of segments to scan */
  const char *zTerm,              /* Term to query for */
  int nTerm,                      /* Size of zTerm in bytes */
  int isPrefix,                   /* True for a prefix search */
  int isScan,                     /* True to scan from zTerm to EOF */
  Fts3MultiSegReader *pCsr        /* Cursor object to populate */
){
  int rc = SQLITE_OK;             /* Error code */
  sqlite3_stmt *pStmt = 0;        /* Statement to iterate through segments */
  int rc2;                        /* Result of sqlite3_reset() */

  /* If iLevel is less than 0 and this is not a scan, include a seg-reader 
  ** for the pending-terms. If this is a scan, then this call must be being
  ** made by an fts4aux module, not an FTS table. In this case calling
  ** Fts3SegReaderPending might segfault, as the data structures used by 
  ** fts4aux are not completely populated. So it's easiest to filter these
  ** calls out here.  */
  if( iLevel<0 && p->aIndex ){
    Fts3SegReader *pSeg = 0;
    rc = sqlite3Fts3SegReaderPending(p, iIndex, zTerm, nTerm, isPrefix||isScan, &pSeg);
    if( rc==SQLITE_OK && pSeg ){
      rc = fts3SegReaderCursorAppend(pCsr, pSeg);
    }
  }

  if( iLevel!=FTS3_SEGCURSOR_PENDING ){
    if( rc==SQLITE_OK ){
      rc = sqlite3Fts3AllSegdirs(p, iLangid, iIndex, iLevel, &pStmt);
    }

    while( rc==SQLITE_OK && SQLITE_ROW==(rc = sqlite3_step(pStmt)) ){
      Fts3SegReader *pSeg = 0;

      /* Read the values returned by the SELECT into local variables. */
      sqlite3_int64 iStartBlock = sqlite3_column_int64(pStmt, 1);
      sqlite3_int64 iLeavesEndBlock = sqlite3_column_int64(pStmt, 2);
      sqlite3_int64 iEndBlock = sqlite3_column_int64(pStmt, 3);
      int nRoot = sqlite3_column_bytes(pStmt, 4);
      char const *zRoot = sqlite3_column_blob(pStmt, 4);

      /* If zTerm is not NULL, and this segment is not stored entirely on its
      ** root node, the range of leaves scanned can be reduced. Do this. */
      if( iStartBlock && zTerm && zRoot ){
        sqlite3_int64 *pi = (isPrefix ? &iLeavesEndBlock : 0);
        rc = fts3SelectLeaf(p, zTerm, nTerm, zRoot, nRoot, &iStartBlock, pi);
        if( rc!=SQLITE_OK ) goto finished;
        if( isPrefix==0 && isScan==0 ) iLeavesEndBlock = iStartBlock;
      }
 
      rc = sqlite3Fts3SegReaderNew(pCsr->nSegment+1, 
          (isPrefix==0 && isScan==0),
          iStartBlock, iLeavesEndBlock, 
          iEndBlock, zRoot, nRoot, &pSeg
      );
      if( rc!=SQLITE_OK ) goto finished;
      rc = fts3SegReaderCursorAppend(pCsr, pSeg);
    }
  }

 finished:
  rc2 = sqlite3_reset(pStmt);
  if( rc==SQLITE_DONE ) rc = rc2;

  return rc;
}